

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

void sprint_long_canframe(char *buf,canfd_frame *cf,int view,int maxdlen)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  __u8 *p_Var4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  __u8 _Var11;
  long lVar12;
  ulong uVar13;
  char cVar14;
  ulong uVar15;
  char *__s;
  long lVar16;
  can_frame *ccf;
  uint uVar17;
  
  uVar17 = (uint)cf->len;
  if (maxdlen <= (int)(uint)cf->len) {
    uVar17 = maxdlen;
  }
  builtin_strncpy(buf,"               ",0xf);
  uVar2 = cf->can_id;
  if ((uVar2 >> 0x1d & 1) == 0) {
    if ((int)uVar2 < 0) {
      uVar2 = uVar2 & 0x1fffffff;
      lVar12 = 8;
      do {
        buf[lVar12 + -1] = "0123456789ABCDEF"[uVar2 & 0xf];
        uVar2 = uVar2 >> 4;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      goto LAB_00103707;
    }
    uVar2 = uVar2 & 0x7ff;
    if ((view & 0x10U) != 0) {
      lVar12 = 7;
      do {
        buf[lVar12] = "0123456789ABCDEF"[uVar2 & 0xf];
        uVar2 = uVar2 >> 4;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 4);
      goto LAB_00103707;
    }
    lVar12 = 3;
    do {
      buf[lVar12 + -1] = "0123456789ABCDEF"[uVar2 & 0xf];
      uVar2 = uVar2 >> 4;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    lVar12 = 5;
  }
  else {
    uVar2 = uVar2 & 0x3fffffff;
    lVar12 = 8;
    do {
      buf[lVar12 + -1] = "0123456789ABCDEF"[uVar2 & 0xf];
      uVar2 = uVar2 >> 4;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
LAB_00103707:
    lVar12 = 10;
  }
  iVar10 = (int)lVar12;
  bVar5 = (byte)uVar17;
  if (maxdlen == 8) {
    if ((view & 0x20U) == 0) {
      buf[lVar12 + 1] = '[';
      bVar5 = bVar5 | 0x30;
      cVar14 = ']';
    }
    else {
      bVar6 = cf->__res1;
      if (6 < (byte)(cf->__res1 - 9)) {
        bVar6 = bVar5;
      }
      if (uVar17 != 8) {
        bVar6 = bVar5;
      }
      buf[lVar12 + 1] = '{';
      bVar5 = "0123456789ABCDEF"[bVar6];
      cVar14 = '}';
    }
    buf[lVar12 + 2] = bVar5;
    buf[lVar12 + 3] = cVar14;
    if ((cf->can_id & 0x40000000) != 0) {
      builtin_strncpy(buf + lVar12 + 5," remote request",0x10);
      return;
    }
  }
  else {
    buf[lVar12] = '[';
    cVar14 = (char)((int)uVar17 / 10);
    buf[lVar12 + 1] = cVar14 + '0';
    buf[lVar12 + 2] = bVar5 + cVar14 * -10 + '0';
    buf[lVar12 + 3] = ']';
  }
  iVar7 = iVar10 + 5;
  if ((view & 2U) == 0) {
    iVar3 = 3;
    if ((view & 4U) == 0) {
      if ((int)uVar17 < 1) goto LAB_0010397a;
      uVar13 = (ulong)(iVar10 + 5);
      uVar15 = 0;
      do {
        buf[uVar13] = ' ';
        bVar5 = cf->data[uVar15];
        buf[uVar13 + 1] = "0123456789ABCDEF"[bVar5 >> 4];
        buf[uVar13 + 2] = "0123456789ABCDEF"[bVar5 & 0xf];
        uVar13 = uVar13 + 3;
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
    }
    else {
      if ((int)uVar17 < 1) goto LAB_0010397a;
      uVar13 = (ulong)(iVar10 + 5);
      lVar12 = (ulong)(uVar17 - 1) + 1;
      lVar16 = 0;
      do {
        buf[uVar13] = (lVar16 != 0) << 6 | 0x20;
        bVar5 = cf->data[lVar16 + (ulong)(uVar17 - 1)];
        buf[uVar13 + 1] = "0123456789ABCDEF"[bVar5 >> 4];
        buf[uVar13 + 2] = "0123456789ABCDEF"[bVar5 & 0xf];
        uVar13 = uVar13 + 3;
        lVar9 = lVar12 + -1;
        bVar1 = 0 < lVar12;
        lVar12 = lVar9;
        lVar16 = lVar16 + -1;
      } while (lVar9 != 0 && bVar1);
    }
    iVar7 = (int)uVar13;
  }
  else {
    iVar3 = 9;
    if ((view & 4U) == 0) {
      if (0 < (int)uVar17) {
        uVar13 = 0;
        do {
          iVar10 = iVar7;
          buf[iVar10] = ' ';
          pbVar8 = (byte *)(buf + (iVar10 + 1));
          iVar7 = -1;
          do {
            *pbVar8 = (cf->data[uVar13] >> (iVar7 + 8U & 0x1f) & 1) == 0 ^ 0x31;
            pbVar8 = pbVar8 + 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -9);
          uVar13 = uVar13 + 1;
          iVar7 = iVar10 + 9;
        } while (uVar13 != uVar17);
        iVar7 = iVar10 + 9;
      }
    }
    else if (0 < (int)uVar17) {
      uVar13 = (ulong)(uVar17 - 1);
      do {
        iVar10 = iVar7;
        buf[iVar10] = (uVar13 != uVar17 - 1) << 6 | 0x20;
        pbVar8 = (byte *)(buf + (iVar10 + 1));
        iVar7 = -1;
        do {
          *pbVar8 = (cf->data[uVar13] >> (iVar7 + 8U & 0x1f) & 1) == 0 ^ 0x31;
          pbVar8 = pbVar8 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != -9);
        bVar1 = 0 < (long)uVar13;
        uVar13 = uVar13 - 1;
        iVar7 = iVar10 + 9;
      } while (bVar1);
      iVar7 = iVar10 + 9;
    }
  }
LAB_0010397a:
  buf[iVar7] = '\0';
  if ((int)uVar17 < 9) {
    __s = buf + iVar7;
    if ((cf->can_id & 0x20000000) != 0) {
      sprintf(__s,"%*s",(ulong)(iVar3 * (8 - uVar17) + 0xd),"ERRORFRAME");
      return;
    }
    if ((view & 1U) != 0) {
      iVar3 = iVar3 * (8 - uVar17);
      uVar13 = (ulong)(iVar3 + 4);
      iVar10 = iVar3 + iVar7 + 4;
      if ((view & 4U) == 0) {
        sprintf(__s,"%*s",uVar13,"\'");
        if (0 < (int)uVar17) {
          uVar13 = 0;
          do {
            _Var11 = cf->data[uVar13];
            if (0x5e < (byte)(_Var11 - 0x20)) {
              _Var11 = '.';
            }
            buf[uVar13 + (long)iVar10] = _Var11;
            uVar13 = uVar13 + 1;
          } while (uVar17 != uVar13);
          iVar10 = iVar10 + (int)uVar13;
        }
        (buf + iVar10)[0] = '\'';
        (buf + iVar10)[1] = '\0';
      }
      else {
        sprintf(__s,"%*s",uVar13,"`");
        if (0 < (int)uVar17) {
          p_Var4 = (__u8 *)(buf + iVar10);
          uVar13 = (ulong)uVar17;
          do {
            _Var11 = cf->data[uVar13 - 1];
            if (0x5e < (byte)(_Var11 - 0x20)) {
              _Var11 = '.';
            }
            *p_Var4 = _Var11;
            p_Var4 = p_Var4 + 1;
            iVar10 = iVar10 + 1;
            bVar1 = 1 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar1);
        }
        (buf + iVar10)[0] = '`';
        (buf + iVar10)[1] = '\0';
      }
    }
  }
  return;
}

Assistant:

void sprint_long_canframe(char *buf , struct canfd_frame *cf, int view, int maxdlen) {
	/* documentation see lib.h */

	int i, j, dlen, offset;
	int len = (cf->len > maxdlen)? maxdlen : cf->len;

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cf->can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cf->can_id & (CAN_ERR_MASK|CAN_ERR_FLAG));
		offset = 10;
	} else if (cf->can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cf->can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cf->can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cf->can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized by maxdlen (see above) */
	if (maxdlen == CAN_MAX_DLEN) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			struct can_frame *ccf = (struct can_frame *)cf;
			unsigned char dlc = ccf->len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cf->can_id & CAN_RTR_FLAG) {
			sprintf(buf+offset+5, " remote request");
			return;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len/10) + '0';
		buf[offset + 2] = (len%10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		dlen = 9; /* _10101010 */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len-1)?' ':SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1<<j & cf->data[i])?'1':'0';
			}
		}
	} else {
		dlen = 3; /* _AA */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len-1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cf->data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return;

	if (cf->can_id & CAN_ERR_FLAG)
		sprintf(buf+offset, "%*s", dlen*(8-len)+13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen*(8-len)+4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf+offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "`");
		} else {
			sprintf(buf+offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cf->data[i] > 0x1F) && (cf->data[i] < 0x7F))
					buf[offset++] = cf->data[i];
				else
					buf[offset++] = '.';

			sprintf(buf+offset, "'");
		}
	}
}